

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

ALLEGRO_USTR * al_ustr_newf(char *fmt,...)

{
  char in_AL;
  ALLEGRO_USTR *pAVar1;
  __va_list_tag *in_R8;
  char *in_R9;
  ALLEGRO_USTR *in_XMM0_Qa;
  va_list ap;
  ALLEGRO_USTR *us;
  ALLEGRO_USTR *in_stack_ffffffffffffff58;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff58 = in_XMM0_Qa;
  }
  pAVar1 = al_ustr_new((char *)0x1f25f9);
  al_ustr_vappendf(in_stack_ffffffffffffff58,in_R9,in_R8);
  return pAVar1;
}

Assistant:

ALLEGRO_USTR *al_ustr_newf(const char *fmt, ...)
{
   ALLEGRO_USTR *us;
   va_list ap;

   us = al_ustr_new("");
   va_start(ap, fmt);
   al_ustr_vappendf(us, fmt, ap);
   va_end(ap);
   return us;
}